

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int walFindFrame(Wal *pWal,Pgno pgno,u32 *piRead)

{
  uint uVar1;
  u32 uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ushort uVar6;
  uint uVar7;
  int iHash;
  ulong uVar8;
  long in_FS_OFFSET;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (pWal->hdr).mxFrame;
  if ((uVar1 == 0) || ((pWal->readLock == 0 && (pWal->bShmUnreliable == '\0')))) {
    *piRead = 0;
    iVar3 = 0;
  }
  else {
    uVar8 = (ulong)(uVar1 + 0x1000) + 0xffffffff021 >> 0xc;
    uVar2 = 0;
    iVar5 = (int)((ulong)(pWal->minFrame + 0x1000) + 0xffffffff021 >> 0xc);
    if (iVar5 <= (int)uVar8) {
      uVar4 = (ulong)(pgno * 0x17f & 0x1fff);
      do {
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._0_4_ = 0xaaaaaaaa;
        local_58._4_4_ = 0xaaaaaaaa;
        local_58._8_4_ = 0xaaaaaaaa;
        local_58._12_4_ = 0xaaaaaaaa;
        iHash = (int)uVar8;
        iVar3 = walHashGet(pWal,iHash,(WalHashLoc *)local_58);
        if (iVar3 != 0) goto LAB_00137ca8;
        uVar6 = *(ushort *)(CONCAT44(local_58._4_4_,local_58._0_4_) + uVar4 * 2);
        if (uVar6 != 0) {
          uVar2 = 0;
          iVar3 = -0x2001;
          uVar8 = uVar4;
          do {
            uVar7 = local_58._16_4_ + (uint)uVar6;
            if (((uVar7 <= uVar1) && (pWal->minFrame <= uVar7)) &&
               (*(Pgno *)(CONCAT44(local_58._12_4_,local_58._8_4_) + -4 + (ulong)uVar6 * 4) == pgno)
               ) {
              uVar2 = uVar7;
            }
            iVar3 = iVar3 + 1;
            if (iVar3 == 0) {
              *piRead = 0;
              iVar3 = 0xb;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10c55,
                          "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
              goto LAB_00137ca8;
            }
            uVar8 = (ulong)((int)uVar8 + 1U & 0x1fff);
            uVar6 = *(ushort *)(CONCAT44(local_58._4_4_,local_58._0_4_) + uVar8 * 2);
          } while (uVar6 != 0);
          if (uVar2 != 0) goto LAB_00137b72;
        }
        uVar8 = (ulong)(iHash - 1);
      } while (iVar5 < iHash);
      uVar2 = 0;
    }
LAB_00137b72:
    iVar3 = 0;
    *piRead = uVar2;
  }
LAB_00137ca8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int walFindFrame(
  Wal *pWal,                      /* WAL handle */
  Pgno pgno,                      /* Database page number to read data for */
  u32 *piRead                     /* OUT: Frame number (or zero) */
){
  u32 iRead = 0;                  /* If !=0, WAL frame to return data from */
  u32 iLast = pWal->hdr.mxFrame;  /* Last page in WAL for this reader */
  int iHash;                      /* Used to loop through N hash tables */
  int iMinHash;

  /* This routine is only be called from within a read transaction. */
  assert( pWal->readLock>=0 || pWal->lockError );

  /* If the "last page" field of the wal-index header snapshot is 0, then
  ** no data will be read from the wal under any circumstances. Return early
  ** in this case as an optimization.  Likewise, if pWal->readLock==0,
  ** then the WAL is ignored by the reader so return early, as if the
  ** WAL were empty.
  */
  if( iLast==0 || (pWal->readLock==0 && pWal->bShmUnreliable==0) ){
    *piRead = 0;
    return SQLITE_OK;
  }

  /* Search the hash table or tables for an entry matching page number
  ** pgno. Each iteration of the following for() loop searches one
  ** hash table (each hash table indexes up to HASHTABLE_NPAGE frames).
  **
  ** This code might run concurrently to the code in walIndexAppend()
  ** that adds entries to the wal-index (and possibly to this hash
  ** table). This means the value just read from the hash
  ** slot (aHash[iKey]) may have been added before or after the
  ** current read transaction was opened. Values added after the
  ** read transaction was opened may have been written incorrectly -
  ** i.e. these slots may contain garbage data. However, we assume
  ** that any slots written before the current read transaction was
  ** opened remain unmodified.
  **
  ** For the reasons above, the if(...) condition featured in the inner
  ** loop of the following block is more stringent that would be required
  ** if we had exclusive access to the hash-table:
  **
  **   (aPgno[iFrame]==pgno):
  **     This condition filters out normal hash-table collisions.
  **
  **   (iFrame<=iLast):
  **     This condition filters out entries that were added to the hash
  **     table after the current read-transaction had started.
  */
  iMinHash = walFramePage(pWal->minFrame);
  for(iHash=walFramePage(iLast); iHash>=iMinHash; iHash--){
    WalHashLoc sLoc;              /* Hash table location */
    int iKey;                     /* Hash slot index */
    int nCollide;                 /* Number of hash collisions remaining */
    int rc;                       /* Error code */
    u32 iH;

    rc = walHashGet(pWal, iHash, &sLoc);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    nCollide = HASHTABLE_NSLOT;
    iKey = walHash(pgno);
    SEH_INJECT_FAULT;
    while( (iH = AtomicLoad(&sLoc.aHash[iKey]))!=0 ){
      u32 iFrame = iH + sLoc.iZero;
      if( iFrame<=iLast && iFrame>=pWal->minFrame && sLoc.aPgno[iH-1]==pgno ){
        assert( iFrame>iRead || CORRUPT_DB );
        iRead = iFrame;
      }
      if( (nCollide--)==0 ){
        *piRead = 0;
        return SQLITE_CORRUPT_BKPT;
      }
      iKey = walNextHash(iKey);
    }
    if( iRead ) break;
  }

#ifdef SQLITE_ENABLE_EXPENSIVE_ASSERT
  /* If expensive assert() statements are available, do a linear search
  ** of the wal-index file content. Make sure the results agree with the
  ** result obtained using the hash indexes above.  */
  {
    u32 iRead2 = 0;
    u32 iTest;
    assert( pWal->bShmUnreliable || pWal->minFrame>0 );
    for(iTest=iLast; iTest>=pWal->minFrame && iTest>0; iTest--){
      if( walFramePgno(pWal, iTest)==pgno ){
        iRead2 = iTest;
        break;
      }
    }
    assert( iRead==iRead2 );
  }
#endif

  *piRead = iRead;
  return SQLITE_OK;
}